

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upnp.cpp
# Opt level: O2

void __thiscall libtorrent::upnp::rootdevice::rootdevice(rootdevice *this,rootdevice *param_1)

{
  undefined8 uVar1;
  address_v4 aVar2;
  bool bVar3;
  
  ::std::__cxx11::string::string((string *)this,(string *)param_1);
  ::std::__cxx11::string::string((string *)&this->control_url,(string *)&param_1->control_url);
  ::std::__cxx11::string::string
            ((string *)&this->service_namespace,(string *)&param_1->service_namespace);
  ::std::vector<libtorrent::upnp::mapping_t,_std::allocator<libtorrent::upnp::mapping_t>_>::vector
            (&(this->mapping).
              super_vector<libtorrent::upnp::mapping_t,_std::allocator<libtorrent::upnp::mapping_t>_>
             ,&(param_1->mapping).
               super_vector<libtorrent::upnp::mapping_t,_std::allocator<libtorrent::upnp::mapping_t>_>
            );
  ::std::__cxx11::string::string((string *)&this->hostname,(string *)&param_1->hostname);
  this->port = param_1->port;
  ::std::__cxx11::string::string((string *)&this->path,(string *)&param_1->path);
  aVar2.addr_.s_addr = (param_1->external_ip).super_address.ipv4_address_.addr_;
  (this->external_ip).super_address.type_ = (param_1->external_ip).super_address.type_;
  (this->external_ip).super_address.ipv4_address_ = (address_v4)aVar2.addr_.s_addr;
  uVar1 = *(undefined8 *)
           ((long)&(param_1->external_ip).super_address.ipv6_address_.addr_.__in6_u + 8);
  *(undefined8 *)&(this->external_ip).super_address.ipv6_address_.addr_.__in6_u =
       *(undefined8 *)&(param_1->external_ip).super_address.ipv6_address_.addr_.__in6_u;
  *(undefined8 *)((long)&(this->external_ip).super_address.ipv6_address_.addr_.__in6_u + 8) = uVar1;
  (this->external_ip).super_address.ipv6_address_.scope_id_ =
       (param_1->external_ip).super_address.ipv6_address_.scope_id_;
  this->disabled = param_1->disabled;
  bVar3 = param_1->supports_specific_external;
  this->use_lease_duration = param_1->use_lease_duration;
  this->supports_specific_external = bVar3;
  ::std::__shared_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->upnp_connection).
              super___shared_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>,
             &(param_1->upnp_connection).
              super___shared_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>);
  return;
}

Assistant:

upnp::rootdevice::rootdevice(rootdevice const&) = default;